

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  cmake *pcVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  undefined1 local_2a8 [8];
  string msg_1;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  ostringstream e;
  undefined1 local_88 [8];
  string currentStartFile;
  string msg;
  undefined1 local_38 [8];
  string currentStart;
  cmMakefile *mf_local;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = mf;
  InitializeFromParent(mf,this);
  psVar3 = GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)currentStart.field_2._8_8_);
  std::__cxx11::string::string((string *)local_38,(string *)psVar3);
  pcVar4 = GetCMakeInstance(this);
  bVar1 = cmake::GetDebugOutput(pcVar4);
  if (bVar1) {
    cmStrCat<char_const(&)[25],std::__cxx11::string&>
              ((string *)((long)&currentStartFile.field_2 + 8),
               (char (*) [25])"   Entering             ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    cmSystemTools::Message((string *)((long)&currentStartFile.field_2 + 8),(char *)0x0);
    std::__cxx11::string::~string((string *)(currentStartFile.field_2._M_local_buf + 8));
  }
  cmStrCat<std::__cxx11::string&,char_const(&)[16]>
            ((string *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [16])0x12147d3);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_88,true);
  if (bVar1) {
    Configure((cmMakefile *)currentStart.field_2._8_8_);
    pcVar4 = GetCMakeInstance(this);
    bVar1 = cmake::GetDebugOutput(pcVar4);
    if (bVar1) {
      psVar3 = GetCurrentSourceDirectory_abi_cxx11_(this);
      cmStrCat<char_const(&)[25],std::__cxx11::string_const&>
                ((string *)local_2a8,(char (*) [25])"   Returning to         ",psVar3);
      cmSystemTools::Message((string *)local_2a8,(char *)0x0);
      std::__cxx11::string::~string((string *)local_2a8);
    }
    msg_1.field_2._12_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar5 = std::operator<<((ostream *)local_200,"The source directory\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_38);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"does not contain a CMakeLists.txt file.");
    PVar2 = GetPolicyStatus(this,CMP0014,false);
    switch(PVar2) {
    case WARN:
      poVar5 = std::operator<<((ostream *)local_200,"\n");
      poVar5 = std::operator<<(poVar5,"CMake does not support this case but it used ");
      poVar5 = std::operator<<(poVar5,"to work accidentally and is being allowed for ");
      poVar5 = std::operator<<(poVar5,"compatibility.");
      poVar5 = std::operator<<(poVar5,"\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_220,(cmPolicies *)0xe,id);
      std::operator<<(poVar5,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
    case OLD:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      poVar5 = std::operator<<((ostream *)local_200,"\n");
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_260,(cmPolicies *)0xe,id_00);
      std::operator<<(poVar5,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    case NEW:
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
    }
    msg_1.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = cmStrCat("   Entering             ", currentStart);
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile =
    cmStrCat(currentStart, "/CMakeLists.txt");
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
        break;
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg =
      cmStrCat("   Returning to         ", this->GetCurrentSourceDirectory());
    cmSystemTools::Message(msg);
  }
}